

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEmbedTest.cpp
# Opt level: O1

int PDFEmbedTest(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _List_node_base *p_Var5;
  string *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  EStatusCode EVar8;
  LogConfiguration *inLogConfiguration;
  EncryptionOptions *pEVar9;
  PDFParsingOptions *inParsingOptions;
  PDFPage *this;
  PageContentContext *inPageContext;
  ResourcesDictionary *pRVar10;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  allocator<char> local_1019;
  undefined1 local_1018 [40];
  string local_ff0;
  EStatusCodeAndObjectIDTypeList result;
  undefined1 local_fb0 [8];
  undefined1 local_fa8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f90;
  _Alloc_hider local_f78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f68;
  string local_f50;
  undefined1 local_f30 [8];
  _Alloc_hider local_f28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f18;
  longlong local_f08;
  _Alloc_hider local_f00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef0;
  PDFWriter pdfWriter;
  
  PDFWriter::PDFWriter(&pdfWriter);
  local_ff0._M_dataplus._M_p = (pointer)&local_ff0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ff0,"PDFEmbedTest.pdf","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1018,argv[2],(allocator<char> *)&local_f50);
  LocalPathToFileURL((FileURL *)local_fb0,(string *)local_1018);
  RelativeURLToLocalPath((string *)&result,(FileURL *)local_fb0,&local_ff0);
  FileURL::~FileURL((FileURL *)local_fb0);
  if ((string *)local_1018._0_8_ != (string *)(local_1018 + 0x10)) {
    operator_delete((void *)local_1018._0_8_,local_1018._16_8_ + 1);
  }
  inLogConfiguration = LogConfiguration::DefaultLogConfiguration();
  pEVar9 = EncryptionOptions::DefaultEncryptionOptions();
  local_f30[0] = pEVar9->ShouldEncrypt;
  pcVar2 = (pEVar9->UserPassword)._M_dataplus._M_p;
  local_f28._M_p = (pointer)&local_f18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f28,pcVar2,pcVar2 + (pEVar9->UserPassword)._M_string_length);
  local_f08 = pEVar9->UserProtectionOptionsFlag;
  pcVar2 = (pEVar9->OwnerPassword)._M_dataplus._M_p;
  local_f00._M_p = (pointer)&local_ef0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f00,pcVar2,pcVar2 + (pEVar9->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            ((PDFCreationSettings *)local_fb0,true,true,(EncryptionOptions *)local_f30,false);
  EVar8 = PDFWriter::StartPDF(&pdfWriter,(string *)&result,ePDFVersion13,inLogConfiguration,
                              (PDFCreationSettings *)local_fb0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f78._M_p != &local_f68) {
    operator_delete(local_f78._M_p,local_f68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa8._8_8_ != &local_f90) {
    operator_delete((void *)local_fa8._8_8_,local_f90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_p != &local_ef0) {
    operator_delete(local_f00._M_p,local_ef0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28._M_p != &local_f18) {
    operator_delete(local_f28._M_p,local_f18._M_allocated_capacity + 1);
  }
  if ((_List_node_base **)CONCAT44(result._4_4_,result.first) !=
      &result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
       .super__List_node_base._M_prev) {
    operator_delete((undefined1 *)CONCAT44(result._4_4_,result.first),
                    (ulong)((long)&(result.second.
                                    super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                    _M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._M_dataplus._M_p != &local_ff0.field_2) {
    operator_delete(local_ff0._M_dataplus._M_p,local_ff0.field_2._M_allocated_capacity + 1);
  }
  if (EVar8 != eSuccess) {
    uVar12 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to start PDF\n",0x14);
    goto LAB_001487d8;
  }
  local_f50._M_dataplus._M_p = (pointer)&local_f50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f50,"XObjectContent.pdf","");
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1018,argv[1],&local_1019);
  LocalPathToFileURL((FileURL *)local_fb0,(string *)local_1018);
  RelativeURLToLocalPath(&local_ff0,(FileURL *)local_fb0,&local_f50);
  FileURL::~FileURL((FileURL *)local_fb0);
  if ((string *)local_1018._0_8_ != (string *)(local_1018 + 0x10)) {
    operator_delete((void *)local_1018._0_8_,local_1018._16_8_ + 1);
  }
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_fb0 + 8);
  local_fa8._16_8_ = 0.0;
  local_fb0._0_4_ = eRangeTypeAll;
  local_1018._16_8_ = 0;
  local_1018._0_8_ = (string *)local_1018;
  local_1018._8_8_ = (string *)local_1018;
  local_fa8._0_8_ = paVar1;
  local_fa8._8_8_ = paVar1;
  inParsingOptions = PDFParsingOptions::DefaultPDFParsingOptions();
  PDFWriter::CreateFormXObjectsFromPDF
            (&result,&pdfWriter,&local_ff0,(PDFPageRange *)local_fb0,ePDFPageBoxMediaBox,
             (double *)0x0,(ObjectIDTypeList *)local_1018,inParsingOptions);
  psVar6 = (string *)local_1018._0_8_;
  while (paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_fa8._0_8_, psVar6 != (string *)local_1018) {
    psVar3 = (string *)(psVar6->_M_dataplus)._M_p;
    operator_delete(psVar6,0x18);
    psVar6 = psVar3;
  }
  while (paVar7 != paVar1) {
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)paVar7->_M_allocated_capacity;
    operator_delete(paVar7,0x20);
    paVar7 = paVar4;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._M_dataplus._M_p != &local_ff0.field_2) {
    operator_delete(local_ff0._M_dataplus._M_p,local_ff0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
    operator_delete(local_f50._M_dataplus._M_p,local_f50.field_2._M_allocated_capacity + 1);
  }
  if (result.first == eSuccess) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    PDFRectangle::PDFRectangle((PDFRectangle *)local_fb0,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,(PDFRectangle *)local_fb0);
    PDFRectangle::~PDFRectangle((PDFRectangle *)local_fb0);
    inPageContext = PDFWriter::StartPageContentContext(&pdfWriter,this);
    AbstractContentContext::q(&inPageContext->super_AbstractContentContext);
    AbstractContentContext::cm
              (&inPageContext->super_AbstractContentContext,0.5,0.0,0.0,0.5,0.0,421.0);
    pRVar10 = PDFPage::GetResourcesDictionary(this);
    ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
              ((string *)local_fb0,pRVar10,
               (ObjectIDType)
               result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               ._M_node.super__List_node_base._M_next[1]._M_next);
    AbstractContentContext::Do(&inPageContext->super_AbstractContentContext,(string *)local_fb0);
    if ((undefined1 *)CONCAT44(local_fb0._4_4_,local_fb0._0_4_) != local_fa8 + 8) {
      operator_delete((undefined1 *)CONCAT44(local_fb0._4_4_,local_fb0._0_4_),
                      (ulong)(local_fa8._8_8_ + 1));
    }
    AbstractContentContext::Q(&inPageContext->super_AbstractContentContext);
    AbstractContentContext::G(&inPageContext->super_AbstractContentContext,0.0);
    AbstractContentContext::w(&inPageContext->super_AbstractContentContext,1.0);
    AbstractContentContext::re(&inPageContext->super_AbstractContentContext,0.0,421.0,297.5,421.0);
    AbstractContentContext::S(&inPageContext->super_AbstractContentContext);
    AbstractContentContext::q(&inPageContext->super_AbstractContentContext);
    AbstractContentContext::cm
              (&inPageContext->super_AbstractContentContext,0.5,0.0,0.0,0.5,297.5,0.0);
    pRVar10 = PDFPage::GetResourcesDictionary(this);
    ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
              ((string *)local_fb0,pRVar10,
               (ObjectIDType)
               result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               ._M_node.super__List_node_base._M_prev[1]._M_next);
    AbstractContentContext::Do(&inPageContext->super_AbstractContentContext,(string *)local_fb0);
    if ((undefined1 *)CONCAT44(local_fb0._4_4_,local_fb0._0_4_) != local_fa8 + 8) {
      operator_delete((undefined1 *)CONCAT44(local_fb0._4_4_,local_fb0._0_4_),
                      (ulong)(local_fa8._8_8_ + 1));
    }
    AbstractContentContext::Q(&inPageContext->super_AbstractContentContext);
    AbstractContentContext::G(&inPageContext->super_AbstractContentContext,0.0);
    AbstractContentContext::w(&inPageContext->super_AbstractContentContext,1.0);
    AbstractContentContext::re(&inPageContext->super_AbstractContentContext,297.5,0.0,297.5,421.0);
    AbstractContentContext::S(&inPageContext->super_AbstractContentContext);
    EVar8 = PDFWriter::EndPageContentContext(&pdfWriter,inPageContext);
    if (EVar8 == eSuccess) {
      EVar8 = PDFWriter::WritePageAndRelease(&pdfWriter,this);
      if (EVar8 == eSuccess) {
        EVar8 = PDFWriter::EndPDF(&pdfWriter);
        if (EVar8 == eSuccess) {
          uVar12 = 0;
          goto LAB_001487b6;
        }
        lVar11 = 0x12;
        pcVar13 = "failed in end PDF\n";
      }
      else {
        lVar11 = 0x15;
        pcVar13 = "failed to write page\n";
      }
    }
    else {
      lVar11 = 0x23;
      pcVar13 = "failed to end page content context\n";
    }
    uVar12 = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,lVar11);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to create PDF XObjects from PDF file\n",0x2c);
    uVar12 = (uint)(result.first != eSuccess);
  }
LAB_001487b6:
  while (result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&result.second) {
    p_Var5 = (result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              _M_node.super__List_node_base._M_next)->_M_next;
    operator_delete(result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl._M_node.super__List_node_base._M_next,0x18);
    result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var5;
  }
LAB_001487d8:
  PDFWriter::~PDFWriter(&pdfWriter);
  return uVar12;
}

Assistant:

int PDFEmbedTest(int argc, char* argv[])
{
	EStatusCode status;
	PDFWriter pdfWriter;

	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv,"PDFEmbedTest.pdf"),ePDFVersion13);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start PDF\n";
			break;
		}	

		// Create XObjects from PDF to embed
		EStatusCodeAndObjectIDTypeList result = pdfWriter.CreateFormXObjectsFromPDF(
                                                        BuildRelativeInputPath(argv,"XObjectContent.pdf"),PDFPageRange(),ePDFPageBoxMediaBox);
		if(result.first != PDFHummus::eSuccess)
		{
			cout<<"failed to create PDF XObjects from PDF file\n";
			status = result.first;
			break;
		}

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));

		PageContentContext* contentContext = pdfWriter.StartPageContentContext(page);

		// place the first page in the top left corner of the document
		contentContext->q();
		contentContext->cm(0.5,0,0,0.5,0,421);
		contentContext->Do(page->GetResourcesDictionary().AddFormXObjectMapping(result.second.front()));
		contentContext->Q();
		
		contentContext->G(0);
		contentContext->w(1);
		contentContext->re(0,421,297.5,421);
		contentContext->S();


		// place the second page in the bottom right corner of the document
		contentContext->q();
		contentContext->cm(0.5,0,0,0.5,297.5,0);
		contentContext->Do(page->GetResourcesDictionary().AddFormXObjectMapping(result.second.back()));
		contentContext->Q();

		contentContext->G(0);
		contentContext->w(1);
		contentContext->re(297.5,0,297.5,421);
		contentContext->S();


		status = pdfWriter.EndPageContentContext(contentContext);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to end page content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to write page\n";
			break;
		}

		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end PDF\n";
			break;
		}

	}while(false);

	return status == eSuccess ? 0:1;
}